

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O0

void __thiscall METADemuxer::openFile(METADemuxer *this,string *streamName)

{
  TextFile *this_00;
  bool bVar1;
  bool bVar2;
  SeiMethod SVar3;
  char *pcVar4;
  long lVar5;
  size_type sVar6;
  ostream *poVar7;
  VodCoreException *this_01;
  ulong uVar8;
  reference pvVar9;
  mapped_type *this_02;
  reference pSVar10;
  H264StreamReader *local_480;
  H264StreamReader *local_468;
  H264StreamReader *reader_1;
  StreamInfo *i_1;
  iterator __end2;
  iterator __begin2;
  vector<StreamInfo,_std::allocator<StreamInfo>_> *__range2;
  bool warned;
  H264StreamReader *reader;
  StreamInfo *si;
  iterator __end1;
  iterator __begin1;
  vector<StreamInfo,_std::allocator<StreamInfo>_> *__range1;
  undefined1 local_398 [4];
  SeiMethod primarySEI;
  undefined1 local_378 [8];
  string codecStreamName;
  string codec;
  allocator<char> local_311;
  string local_310;
  string local_2f0;
  undefined1 local_2d0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tmp;
  undefined1 local_2b0 [4];
  uint i;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  addParams;
  string local_278;
  ostringstream local_258 [8];
  ostringstream ss;
  undefined1 local_e0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  params;
  string local_c0;
  string local_a0;
  undefined1 local_70 [8];
  string str;
  TextFile file;
  string *streamName_local;
  METADemuxer *this_local;
  
  std::__cxx11::string::operator=((string *)&this->m_streamName,(string *)streamName);
  readClose(this);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  this_00 = (TextFile *)((long)&str.field_2 + 8);
  TextFile::TextFile(this_00,pcVar4,1,0);
  std::__cxx11::string::string((string *)local_70);
  TextFile::readLine(this_00,(string *)local_70);
  while (lVar5 = std::__cxx11::string::length(), lVar5 != 0) {
    trimStr(&local_a0,(string *)local_70);
    std::__cxx11::string::operator=((string *)local_70,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    lVar5 = std::__cxx11::string::length();
    if ((lVar5 == 0) ||
       (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_70), *pcVar4 == '#')) {
      TextFile::readLine((TextFile *)((long)&str.field_2 + 8),(string *)local_70);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"MUXOPT",
                 (allocator<char> *)
                 ((long)&params.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      bVar1 = strStartWith((string *)local_70,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&params.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      if (bVar1) {
        TextFile::readLine((TextFile *)((long)&str.field_2 + 8),(string *)local_70);
      }
      else {
        pcVar4 = (char *)std::__cxx11::string::c_str();
        splitQuotedStr_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_e0,pcVar4,',');
        sVar6 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_e0);
        if (sVar6 < 2) {
          std::__cxx11::ostringstream::ostringstream(local_258);
          poVar7 = std::operator<<((ostream *)local_258,"Invalid codec format: ");
          std::operator<<(poVar7,(string *)local_70);
          addParams._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
          this_01 = (VodCoreException *)__cxa_allocate_exception(0x28);
          std::__cxx11::ostringstream::str();
          VodCoreException::VodCoreException(this_01,0x1f6,&local_278);
          addParams._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
          __cxa_throw(this_01,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
        }
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_2b0);
        for (tmp.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 2;
            uVar8 = (ulong)tmp.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
            sVar6 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_e0), uVar8 < sVar6;
            tmp.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                 tmp.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_e0,
                       (ulong)tmp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          splitStr_abi_cxx11_((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_2d0,pcVar4,'=');
          sVar6 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_2d0);
          if (sVar6 < 2) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"",&local_311);
          }
          else {
            pvVar9 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_2d0,1);
            std::__cxx11::string::string((string *)&local_310,(string *)pvVar9);
          }
          trimStr(&local_2f0,&local_310);
          pvVar9 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_2d0,0);
          trimStr((string *)((long)&codec.field_2 + 8),pvVar9);
          this_02 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)local_2b0,(key_type *)((long)&codec.field_2 + 8));
          std::__cxx11::string::operator=((string *)this_02,(string *)&local_2f0);
          std::__cxx11::string::~string((string *)(codec.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)&local_2f0);
          std::__cxx11::string::~string((string *)&local_310);
          if (sVar6 < 2) {
            std::allocator<char>::~allocator(&local_311);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_2d0);
        }
        pvVar9 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_e0,0);
        trimStr((string *)((long)&codecStreamName.field_2 + 8),pvVar9);
        pvVar9 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_e0,1);
        trimStr((string *)local_378,pvVar9);
        strToUpperCase((string *)local_398,(string *)((long)&codecStreamName.field_2 + 8));
        std::__cxx11::string::operator=
                  ((string *)(codecStreamName.field_2._M_local_buf + 8),(string *)local_398);
        std::__cxx11::string::~string((string *)local_398);
        if ((this->m_HevcFound & 1U) == 0) {
          lVar5 = std::__cxx11::string::find(codecStreamName.field_2._M_local_buf + 8,0x3b21b4);
          this->m_HevcFound = lVar5 == 0xc;
        }
        addStream(this,(string *)((long)&codecStreamName.field_2 + 8),(string *)local_378,
                  (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_2b0);
        TextFile::readLine((TextFile *)((long)&str.field_2 + 8),(string *)local_70);
        std::__cxx11::string::~string((string *)local_378);
        std::__cxx11::string::~string((string *)(codecStreamName.field_2._M_local_buf + 8));
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_2b0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_e0);
      }
    }
  }
  __range1._4_4_ = SEI_NotDefined;
  __end1 = std::vector<StreamInfo,_std::allocator<StreamInfo>_>::begin(&this->m_codecInfo);
  si = (StreamInfo *)std::vector<StreamInfo,_std::allocator<StreamInfo>_>::end(&this->m_codecInfo);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<StreamInfo_*,_std::vector<StreamInfo,_std::allocator<StreamInfo>_>_>
                                *)&si);
    if (!bVar1) {
LAB_002d68d0:
      if (__range1._4_4_ != SEI_NotDefined) {
        bVar1 = false;
        __end2 = std::vector<StreamInfo,_std::allocator<StreamInfo>_>::begin(&this->m_codecInfo);
        i_1 = (StreamInfo *)
              std::vector<StreamInfo,_std::allocator<StreamInfo>_>::end(&this->m_codecInfo);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<StreamInfo_*,_std::vector<StreamInfo,_std::allocator<StreamInfo>_>_>
                                           *)&i_1), bVar2) {
          pSVar10 = __gnu_cxx::
                    __normal_iterator<StreamInfo_*,_std::vector<StreamInfo,_std::allocator<StreamInfo>_>_>
                    ::operator*(&__end2);
          if (pSVar10->m_streamReader == (AbstractStreamReader *)0x0) {
            local_480 = (H264StreamReader *)0x0;
          }
          else {
            local_480 = (H264StreamReader *)
                        __dynamic_cast(pSVar10->m_streamReader,&AbstractStreamReader::typeinfo,
                                       &H264StreamReader::typeinfo,0);
          }
          if ((local_480 != (H264StreamReader *)0x0) &&
             (bVar2 = H264StreamReader::isSubStream(local_480), bVar2)) {
            if ((!bVar1) &&
               (SVar3 = H264StreamReader::getInsertSEI(local_480), SVar3 != __range1._4_4_)) {
              poVar7 = std::operator<<((ostream *)&std::cout,
                                       "Parameter \'insertSEI\' for MVC dependent view differs from same param for AVC base view. Ignore and apply same value"
                                      );
              std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
              sLastMsg = true;
              bVar1 = true;
            }
            H264StreamReader::setInsertSEI(local_480,__range1._4_4_);
          }
          __gnu_cxx::
          __normal_iterator<StreamInfo_*,_std::vector<StreamInfo,_std::allocator<StreamInfo>_>_>::
          operator++(&__end2);
        }
      }
      std::__cxx11::string::~string((string *)local_70);
      TextFile::~TextFile((TextFile *)((long)&str.field_2 + 8));
      return;
    }
    pSVar10 = __gnu_cxx::
              __normal_iterator<StreamInfo_*,_std::vector<StreamInfo,_std::allocator<StreamInfo>_>_>
              ::operator*(&__end1);
    if (pSVar10->m_streamReader == (AbstractStreamReader *)0x0) {
      local_468 = (H264StreamReader *)0x0;
    }
    else {
      local_468 = (H264StreamReader *)
                  __dynamic_cast(pSVar10->m_streamReader,&AbstractStreamReader::typeinfo,
                                 &H264StreamReader::typeinfo,0);
    }
    if ((local_468 != (H264StreamReader *)0x0) &&
       (bVar1 = H264StreamReader::isSubStream(local_468), !bVar1)) {
      __range1._4_4_ = H264StreamReader::getInsertSEI(local_468);
      goto LAB_002d68d0;
    }
    __gnu_cxx::
    __normal_iterator<StreamInfo_*,_std::vector<StreamInfo,_std::allocator<StreamInfo>_>_>::
    operator++(&__end1);
  } while( true );
}

Assistant:

void METADemuxer::openFile(const string& streamName)
{
    m_streamName = streamName;
    readClose();

    TextFile file(m_streamName.c_str(), File::ofRead);
    string str;
    file.readLine(str);
    while (str.length() > 0)
    {
        str = trimStr(str);
        if (str.length() == 0 || str[0] == '#')
        {
            file.readLine(str);
            continue;
        }
        if (strStartWith(str, "MUXOPT"))
        {
            file.readLine(str);
            continue;
        }
        vector<string> params = splitQuotedStr(str.c_str(), ',');
        if (params.size() < 2)
            THROW(ERR_INVALID_CODEC_FORMAT, "Invalid codec format: " << str)
        map<string, string> addParams;
        for (unsigned i = 2; i < params.size(); i++)
        {
            // params[i] = strToLowerCase ( params[i] );
            vector<string> tmp = splitStr(params[i].c_str(), '=');
            addParams[trimStr(tmp[0])] = trimStr(tmp.size() > 1 ? tmp[1] : "");
        }
        string codec = trimStr(params[0]);
        string codecStreamName = trimStr(params[1]);
        codec = strToUpperCase(codec);
        if (!m_HevcFound)
            m_HevcFound = (codec.find("HEVC") == 12);
        addStream(codec, codecStreamName, addParams);
        file.readLine(str);
    }

    auto primarySEI = H264StreamReader::SeiMethod::SEI_NotDefined;
    for (const auto& si : m_codecInfo)
    {
        const auto reader = dynamic_cast<H264StreamReader*>(si.m_streamReader);
        if (reader && !reader->isSubStream())
        {
            primarySEI = reader->getInsertSEI();
            break;
        }
    }

    if (primarySEI != H264StreamReader::SeiMethod::SEI_NotDefined)
    {
        bool warned = false;
        for (const auto& i : m_codecInfo)
        {
            const auto reader = dynamic_cast<H264StreamReader*>(i.m_streamReader);
            if (reader && reader->isSubStream())
            {
                if (!warned && reader->getInsertSEI() != primarySEI)
                {
                    LTRACE(LT_INFO, 2,
                           "Parameter 'insertSEI' for MVC dependent view differs from same param for AVC base view. "
                           "Ignore and apply same value");
                    warned = true;
                }
                reader->setInsertSEI(primarySEI);
            }
        }
    }
}